

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

bool __thiscall mjs::object::can_put(object *this,wstring_view *name)

{
  bool bVar1;
  property_attribute a_00;
  gc_heap *h;
  object *this_00;
  property_attribute a;
  wstring_view *name_local;
  object *this_local;
  
  a_00 = own_property_attributes(this,name);
  bVar1 = is_valid(a_00);
  if (bVar1) {
    bVar1 = has_attributes(a_00,read_only);
    this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
  }
  else {
    bVar1 = mjs::gc_heap_ptr_untracked::operator_cast_to_bool
                      ((gc_heap_ptr_untracked *)&this->prototype_);
    if (bVar1) {
      h = heap(this);
      this_00 = gc_heap_ptr_untracked<mjs::object,_true>::dereference(&this->prototype_,h);
      this_local._7_1_ = can_put(this_00,name);
    }
    else {
      this_local._7_1_ = (bool)(this->extensible_ & 1);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool object::can_put(const std::wstring_view& name) const {
    auto a = own_property_attributes(name);
    if (is_valid(a)) {
        return !has_attributes(a, property_attribute::read_only);
    }
    if (!prototype_) {
        return extensible_;
    }
    return prototype_.dereference(heap()).can_put(name);
}